

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O2

void __thiscall Assimp::X3DImporter::Throw_TagCountIncorrect(X3DImporter *this,string *pNode)

{
  DeadlyImportError *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::operator+(&bStack_58,"Count of open and close tags for node <",pNode);
  std::operator+(&local_38,&bStack_58,"> are not equivalent. Seems file is corrupt.");
  DeadlyImportError::DeadlyImportError(this_00,&local_38);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void X3DImporter::Throw_TagCountIncorrect(const std::string& pNode)
{
	throw DeadlyImportError("Count of open and close tags for node <" + pNode + "> are not equivalent. Seems file is corrupt.");
}